

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O2

int __thiscall MPLSParser::composeSTN_tableSS(MPLSParser *this,uint8_t *buffer,int bufferSize)

{
  int iVar1;
  MPLSStreamInfo *other;
  size_t PlayItem_id;
  ulong PlayItem_id_00;
  BitStreamWriter writer;
  MPLSStreamInfo streamInfoMVC;
  
  writer.super_BitStream.m_totalBits = 0;
  writer.m_curVal = 0;
  writer.m_bitWrited = 0;
  writer.super_BitStream.m_buffer = (uint *)0x0;
  writer.super_BitStream.m_initBuffer = (uint *)0x0;
  BitStreamWriter::setBuffer(&writer,buffer,buffer + bufferSize);
  other = getMVCDependStream(this);
  MPLSStreamInfo::MPLSStreamInfo(&streamInfoMVC,other);
  for (PlayItem_id_00 = 0;
      PlayItem_id_00 <
      (ulong)(((long)streamInfoMVC.super_M2TSStreamInfo.m_index.
                     super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)streamInfoMVC.super_M2TSStreamInfo.m_index.
                    super__Vector_base<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>,_std::allocator<std::map<unsigned_long,_PMTIndexData,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_PMTIndexData>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x30);
      PlayItem_id_00 = PlayItem_id_00 + 1) {
    composeSTN_table(this,&writer,PlayItem_id_00,true);
  }
  BitStreamWriter::flushBits(&writer);
  iVar1 = ((int)writer.super_BitStream.m_buffer - (int)writer.super_BitStream.m_initBuffer) * 8 +
          writer.m_bitWrited;
  MPLSStreamInfo::~MPLSStreamInfo(&streamInfoMVC);
  return iVar1 / 8;
}

Assistant:

int MPLSParser::composeSTN_tableSS(uint8_t* buffer, const int bufferSize)
{
    BitStreamWriter writer{};
    writer.setBuffer(buffer, buffer + bufferSize);
    try
    {
        const MPLSStreamInfo streamInfoMVC = getMVCDependStream();
        for (size_t PlayItem_id = 0; PlayItem_id < streamInfoMVC.m_index.size(); PlayItem_id++)
        {
            composeSTN_table(writer, PlayItem_id, true);
            // connection_condition = 6;
        }
        writer.flushBits();
        return writer.getBitsCount() / 8;
    }
    catch (...)
    {
        return 0;
    }
}